

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O1

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
IndexTools::JointToIndividualIndices
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          LIndex jointI,vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems)

{
  pointer puVar1;
  LIndex *pLVar2;
  ulong uVar3;
  ulong uVar4;
  allocator_type local_29;
  
  uVar4 = (long)(nrElems->
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(nrElems->
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
  uVar3 = (long)uVar4 >> 3;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (__return_storage_ptr__,uVar3 & 0xffffffff,&local_29);
  if ((int)(uVar4 >> 3) != 0) {
    pLVar2 = CalculateStepSize(nrElems);
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      puVar1[uVar4] = jointI / pLVar2[uVar4];
      jointI = jointI % pLVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0xffffffff) != uVar4);
    operator_delete__(pLVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<LIndex> IndexTools::JointToIndividualIndices(LIndex jointI,
       const vector<LIndex>& nrElems) 
{
    LIndex* step_size=0;
    Index vec_size = nrElems.size();
    vector<LIndex> result(vec_size);    
    if(vec_size > 0)
    {
        step_size=CalculateStepSize(nrElems);
        LIndex remainder = jointI;
        for(Index i=0; i < vec_size ; i++)
        {
            LIndex aI = remainder / step_size[i];
            result[i]= aI;//store this indiv. index
            remainder = remainder %  step_size[i];
        }
        delete [] step_size;
    }
    return(result);
}